

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O2

void __thiscall FTraceInfo::SetSourcePosition(FTraceInfo *this)

{
  FTraceResults *pFVar1;
  double dVar2;
  double in_RAX;
  double local_18;
  
  pFVar1 = this->Results;
  (pFVar1->SrcFromTarget).Z = (this->Start).Z;
  dVar2 = (this->Start).Y;
  (pFVar1->SrcFromTarget).X = (this->Start).X;
  (pFVar1->SrcFromTarget).Y = dVar2;
  (pFVar1->HitVector).Z = (this->Vec).Z;
  dVar2 = (this->Vec).Y;
  (pFVar1->HitVector).X = (this->Vec).X;
  (pFVar1->HitVector).Y = dVar2;
  local_18 = in_RAX;
  TVector3<double>::Angle((TVector3<double> *)&local_18);
  (this->Results->SrcAngleFromTarget).Degrees = local_18;
  return;
}

Assistant:

void SetSourcePosition()
	{
		Results->SrcFromTarget = Start;
		Results->HitVector = Vec;
		Results->SrcAngleFromTarget = Results->HitVector.Angle();
	}